

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateRegressorInterface
                   (Result *__return_storage_ptr__,ModelDescription *description,int modelVersion)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  bool bVar1;
  string *psVar2;
  CoreML *this;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_b9;
  TypeCase local_b8 [2];
  iterator local_b0;
  size_type local_a8;
  undefined1 local_a0 [75];
  undefined1 local_55;
  allocator local_41;
  string local_40;
  ModelDescription *pMStack_18;
  int modelVersion_local;
  ModelDescription *description_local;
  Result *result;
  
  local_40._M_storage._M_storage._4_4_ = modelVersion;
  pMStack_18 = description;
  description_local = (ModelDescription *)__return_storage_ptr__;
  psVar2 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(description);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar2,"");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_40,"Specification is missing regressor predictedFeatureName.",
               &local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    local_55 = 0;
    validateFeatureDescriptions
              (__return_storage_ptr__,pMStack_18,local_40._M_storage._M_storage._4_4_);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      this = (CoreML *)Specification::ModelDescription::output(pMStack_18);
      psVar2 = Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMStack_18);
      local_b8[0] = kDoubleType;
      local_b8[1] = 5;
      local_b0 = local_b8;
      local_a8 = 2;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_b9);
      __l._M_len = local_a8;
      __l._M_array = local_b0;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_a0,__l,&local_b9);
      validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)(local_a0 + 0x18),this,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)psVar2,
                 (string *)local_a0,in_R8);
      Result::operator=(__return_storage_ptr__,(Result *)(local_a0 + 0x18));
      Result::~Result((Result *)(local_a0 + 0x18));
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 *)local_a0);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_b9);
      Result::good(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateRegressorInterface(const Specification::ModelDescription& description, int modelVersion) {
        
        if (description.predictedfeaturename() == "") {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing regressor predictedFeatureName.");
        }
        
        // Validate feature descriptions
        Result result = validateFeatureDescriptions(description, modelVersion);
        if (!result.good()) {
            return result;
        }

        result = validateDescriptionsContainFeatureWithNameAndType(description.output(),
                                                                   description.predictedfeaturename(),
                                                                   {Specification::FeatureType::kDoubleType, Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }
        return result;
    }